

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::SetModuleVariables
          (cmFindPackageCommand *this,string *components,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
          *componentVarDefs)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *this_00;
  bool bVar1;
  reference var;
  ulong uVar2;
  string_view sVar3;
  cmAlphaNum local_7c8;
  cmAlphaNum local_798;
  string local_768;
  size_t local_748;
  char *pcStack_740;
  cmAlphaNum local_738;
  cmAlphaNum local_708;
  string local_6d8;
  size_t local_6b8;
  char *pcStack_6b0;
  cmAlphaNum local_6a8;
  cmAlphaNum local_678;
  string local_648;
  string_view local_628;
  cmAlphaNum local_618;
  cmAlphaNum local_5e8;
  undefined1 local_5b8 [8];
  string id;
  cmAlphaNum local_558;
  cmAlphaNum local_528;
  string local_4f8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_4d8;
  string_view local_4b8;
  string_view local_4a8;
  cmAlphaNum local_498;
  cmAlphaNum local_468;
  undefined1 local_438 [8];
  string prefix_1;
  cmAlphaNum local_3f8;
  cmAlphaNum local_3c8;
  undefined1 local_398 [8];
  string exact;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  undefined1 local_2d0 [8];
  string prefix;
  anon_class_8_1_8991fb9c addDefinition;
  cmAlphaNum local_298;
  cmAlphaNum local_268;
  undefined1 local_238 [8];
  string req_1;
  cmAlphaNum local_1f8;
  cmAlphaNum local_1c8;
  undefined1 local_198 [8];
  string req;
  cmAlphaNum local_150;
  cmAlphaNum local_120;
  undefined1 local_f0 [8];
  string quietly;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *varDef;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *__range1;
  undefined1 local_90 [8];
  string components_var;
  allocator<char> local_49;
  string local_48;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *local_28;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *componentVarDefs_local;
  string *components_local;
  cmFindPackageCommand *this_local;
  
  local_28 = componentVarDefs;
  componentVarDefs_local =
       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        *)components;
  components_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_FIND_PACKAGE_NAME",&local_49);
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Name);
  components_var.field_2._8_8_ = sVar3._M_len;
  AddFindDefinition(this,&local_48,sVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &this->Name,"_FIND_COMPONENTS");
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)componentVarDefs_local)
  ;
  AddFindDefinition(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90,sVar3);
  this_00 = local_28;
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
           ::begin(local_28);
  varDef = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
              ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
                                *)&varDef);
    if (!bVar1) break;
    var = __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
          ::operator*(&__end1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&quietly.field_2 + 8),
               var->second);
    AddFindDefinition(this,&var->first,stack0xffffffffffffff30);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
    ::operator++(&__end1);
  }
  if ((this->Quiet & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_120,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_150,"_FIND_QUIETLY");
    cmStrCat<>((string *)local_f0,&local_120,&local_150);
    sVar3 = (string_view)::cm::operator____s("1",1);
    req.field_2._8_8_ = sVar3._M_len;
    AddFindDefinition(this,(string *)local_f0,sVar3);
    std::__cxx11::string::~string((string *)local_f0);
  }
  if ((this->Required & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_1c8,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_1f8,"_FIND_REQUIRED");
    cmStrCat<>((string *)local_198,&local_1c8,&local_1f8);
    sVar3 = (string_view)::cm::operator____s("1",1);
    req_1.field_2._8_8_ = sVar3._M_len;
    AddFindDefinition(this,(string *)local_198,sVar3);
    std::__cxx11::string::~string((string *)local_198);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_268,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_298,"_FIND_VERSION_COMPLETE");
    cmStrCat<>((string *)local_238,&local_268,&local_298);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&this->VersionComplete);
    AddFindDefinition(this,(string *)local_238,sVar3);
    std::__cxx11::string::~string((string *)local_238);
  }
  prefix.field_2._8_8_ = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_300,&this->Name);
    sVar3 = (string_view)::cm::operator____s("_FIND_VERSION",0xd);
    cmAlphaNum::cmAlphaNum(&local_330,sVar3);
    cmStrCat<>((string *)local_2d0,&local_300,&local_330);
    std::
    function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<cmFindPackageCommand::SetModuleVariables(std::__cxx11::string_const&,std::vector<std::pair<std::__cxx11::string,char_const*>,std::allocator<std::pair<std::__cxx11::string,char_const*>>>const&)::__0&,void>
              ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
                *)(exact.field_2._M_local_buf + 8),
               (anon_class_8_1_8991fb9c *)((long)&prefix.field_2 + 8));
    SetVersionVariables(this,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                              *)(exact.field_2._M_local_buf + 8),(string *)local_2d0,&this->Version,
                        this->VersionCount,this->VersionMajor,this->VersionMinor,this->VersionPatch,
                        this->VersionTweak);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)((long)&exact.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_3c8,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_3f8,"_FIND_VERSION_EXACT");
    cmStrCat<>((string *)local_398,&local_3c8,&local_3f8);
    if ((this->VersionExact & 1U) == 0) {
      sVar3 = (string_view)::cm::operator____s("0",1);
    }
    else {
      sVar3 = (string_view)::cm::operator____s("1",1);
    }
    prefix_1.field_2._8_8_ = sVar3._M_len;
    AddFindDefinition(this,(string *)local_398,sVar3);
    std::__cxx11::string::~string((string *)local_398);
    std::__cxx11::string::~string((string *)local_2d0);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_468,&this->Name);
    local_4b8 = (string_view)::cm::operator____s("_FIND_VERSION_MIN",0x11);
    local_4a8 = local_4b8;
    cmAlphaNum::cmAlphaNum(&local_498,local_4b8);
    cmStrCat<>((string *)local_438,&local_468,&local_498);
    std::
    function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<cmFindPackageCommand::SetModuleVariables(std::__cxx11::string_const&,std::vector<std::pair<std::__cxx11::string,char_const*>,std::allocator<std::pair<std::__cxx11::string,char_const*>>>const&)::__0&,void>
              ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
                *)&local_4d8,(anon_class_8_1_8991fb9c *)((long)&prefix.field_2 + 8));
    SetVersionVariables(this,&local_4d8,(string *)local_438,&this->Version,this->VersionCount,
                        this->VersionMajor,this->VersionMinor,this->VersionPatch,this->VersionTweak)
    ;
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function(&local_4d8);
    cmAlphaNum::cmAlphaNum(&local_528,&this->Name);
    sVar3 = (string_view)::cm::operator____s("_FIND_VERSION_MAX",0x11);
    cmAlphaNum::cmAlphaNum(&local_558,sVar3);
    cmStrCat<>(&local_4f8,&local_528,&local_558);
    std::__cxx11::string::operator=((string *)local_438,(string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::
    function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<cmFindPackageCommand::SetModuleVariables(std::__cxx11::string_const&,std::vector<std::pair<std::__cxx11::string,char_const*>,std::allocator<std::pair<std::__cxx11::string,char_const*>>>const&)::__0&,void>
              ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
                *)(id.field_2._M_local_buf + 8),
               (anon_class_8_1_8991fb9c *)((long)&prefix.field_2 + 8));
    SetVersionVariables(this,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                              *)(id.field_2._M_local_buf + 8),(string *)local_438,&this->VersionMax,
                        this->VersionMaxCount,this->VersionMaxMajor,this->VersionMaxMinor,
                        this->VersionMaxPatch,this->VersionMaxTweak);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)((long)&id.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_5e8,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_618,"_FIND_VERSION_RANGE");
    cmStrCat<>((string *)local_5b8,&local_5e8,&local_618);
    local_628 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&this->VersionRange);
    AddFindDefinition(this,(string *)local_5b8,local_628);
    cmAlphaNum::cmAlphaNum(&local_678,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_6a8,"_FIND_VERSION_RANGE_MIN");
    cmStrCat<>(&local_648,&local_678,&local_6a8);
    std::__cxx11::string::operator=((string *)local_5b8,(string *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    local_6b8 = (this->VersionRangeMin)._M_len;
    pcStack_6b0 = (this->VersionRangeMin)._M_str;
    AddFindDefinition(this,(string *)local_5b8,this->VersionRangeMin);
    cmAlphaNum::cmAlphaNum(&local_708,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_738,"_FIND_VERSION_RANGE_MAX");
    cmStrCat<>(&local_6d8,&local_708,&local_738);
    std::__cxx11::string::operator=((string *)local_5b8,(string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_6d8);
    local_748 = (this->VersionRangeMax)._M_len;
    pcStack_740 = (this->VersionRangeMax)._M_str;
    AddFindDefinition(this,(string *)local_5b8,this->VersionRangeMax);
    std::__cxx11::string::~string((string *)local_5b8);
    std::__cxx11::string::~string((string *)local_438);
  }
  if ((this->RegistryViewDefined & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_798,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_7c8,"_FIND_REGISTRY_VIEW");
    cmStrCat<>(&local_768,&local_798,&local_7c8);
    sVar3 = cmWindowsRegistry::FromView((this->super_cmFindCommon).RegistryView);
    AddFindDefinition(this,&local_768,sVar3);
    std::__cxx11::string::~string((string *)&local_768);
  }
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void cmFindPackageCommand::SetModuleVariables(
  const std::string& components,
  const std::vector<std::pair<std::string, const char*>>& componentVarDefs)
{
  this->AddFindDefinition("CMAKE_FIND_PACKAGE_NAME", this->Name);

  // Store the list of components and associated variable definitions
  std::string components_var = this->Name + "_FIND_COMPONENTS";
  this->AddFindDefinition(components_var, components);
  for (const auto& varDef : componentVarDefs) {
    this->AddFindDefinition(varDef.first, varDef.second);
  }

  if (this->Quiet) {
    // Tell the module that is about to be read that it should find
    // quietly.
    std::string quietly = cmStrCat(this->Name, "_FIND_QUIETLY");
    this->AddFindDefinition(quietly, "1"_s);
  }

  if (this->Required) {
    // Tell the module that is about to be read that it should report
    // a fatal error if the package is not found.
    std::string req = cmStrCat(this->Name, "_FIND_REQUIRED");
    this->AddFindDefinition(req, "1"_s);
  }

  if (!this->VersionComplete.empty()) {
    std::string req = cmStrCat(this->Name, "_FIND_VERSION_COMPLETE");
    this->AddFindDefinition(req, this->VersionComplete);
  }

  // Tell the module that is about to be read what version of the
  // package has been requested.
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->AddFindDefinition(variable, value);
  };

  if (!this->Version.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    // Tell the module whether an exact version has been requested.
    auto exact = cmStrCat(this->Name, "_FIND_VERSION_EXACT");
    this->AddFindDefinition(exact, this->VersionExact ? "1"_s : "0"_s);
  }
  if (!this->VersionRange.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION_MIN"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    prefix = cmStrCat(this->Name, "_FIND_VERSION_MAX"_s);
    this->SetVersionVariables(addDefinition, prefix, this->VersionMax,
                              this->VersionMaxCount, this->VersionMaxMajor,
                              this->VersionMaxMinor, this->VersionMaxPatch,
                              this->VersionMaxTweak);

    auto id = cmStrCat(this->Name, "_FIND_VERSION_RANGE");
    this->AddFindDefinition(id, this->VersionRange);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MIN");
    this->AddFindDefinition(id, this->VersionRangeMin);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MAX");
    this->AddFindDefinition(id, this->VersionRangeMax);
  }

  if (this->RegistryViewDefined) {
    this->AddFindDefinition(cmStrCat(this->Name, "_FIND_REGISTRY_VIEW"),
                            cmWindowsRegistry::FromView(this->RegistryView));
  }
}